

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O2

void __thiscall DRAG<TTA>::FirstScan(DRAG<TTA> *this)

{
  long lVar1;
  char cVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int r;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar9 = (long)*(int *)&pMVar3->field_0x8;
  lVar20 = (long)*(int *)&pMVar3->field_0xc;
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  uVar17 = 0;
  do {
    if (lVar9 <= (long)uVar17) {
      return;
    }
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar11 = **(long **)&pMVar3->field_0x48;
    lVar14 = lVar11 * uVar17 + *(long *)&pMVar3->field_0x10;
    lVar13 = lVar14 - lVar11;
    lVar16 = lVar13 - lVar11;
    lVar11 = lVar11 + lVar14;
    lVar5 = **(long **)&pMVar4->field_0x48;
    lVar18 = lVar5 * uVar17 + *(long *)&pMVar4->field_0x10;
    lVar12 = lVar18 + lVar5 * -2;
    lVar5 = lVar16 + -1;
    uVar7 = uVar17 | 1;
    for (uVar19 = 0; (long)uVar19 < lVar20; uVar19 = uVar19 + 2) {
      if (*(char *)(lVar14 + uVar19) == '\0') {
        if (((long)uVar7 < lVar9) && (*(char *)(lVar11 + uVar19) != '\0')) {
          uVar10 = uVar19 | 1;
          if (((long)uVar10 < lVar20) && (*(char *)(lVar14 + uVar10) != '\0')) {
            uVar8 = 1;
            if (uVar19 != 0) {
              if (*(char *)((uVar19 - 1) + lVar14) != '\0') {
                if (uVar17 != 0) {
                  if (*(char *)(lVar13 + uVar10) == '\0') goto LAB_0011e986;
                  goto LAB_0011e873;
                }
                goto LAB_0011eda2;
              }
              uVar8 = uVar10;
              if (*(char *)(lVar11 + -1 + uVar19) == '\0') goto LAB_0011e92e;
              if (uVar17 == 0) goto LAB_0011eda2;
              if (*(char *)(lVar13 + uVar10) == '\0') {
                if ((lVar20 <= (long)(uVar19 + 2)) || (*(char *)(lVar13 + uVar19 + 2) == '\0')) {
                  if (*(char *)(lVar13 + uVar19) == '\0') goto LAB_0011eda2;
                  cVar2 = *(char *)((uVar19 - 2) + lVar14);
                  goto joined_r0x0011ed97;
                }
                if (*(char *)(lVar16 + uVar10) == '\0') {
                  if (*(char *)(lVar13 + uVar19) != '\0') {
                    if (*(char *)(lVar14 + -2 + uVar19) == '\0') {
                      uVar6 = *(uint *)(lVar12 + uVar19 * 4);
                      goto LAB_0011ee3b;
                    }
                    if (*(char *)(lVar13 + -1 + uVar19) == '\0') goto LAB_0011edc8;
                    goto LAB_0011ec72;
                  }
                  goto LAB_0011e9b7;
                }
              }
              if (*(char *)((uVar19 - 2) + lVar14) == '\0') goto LAB_0011ecd6;
LAB_0011ea0d:
              if (uVar19 != 0 && uVar17 != 0) {
                if (*(char *)(lVar13 + -1 + uVar19) != '\0') {
LAB_0011ebd3:
                  if (uVar17 != 0) {
                    if (*(char *)(lVar13 + uVar19) != '\0') goto LAB_0011eb2d;
                    goto LAB_0011ea7d;
                  }
                  goto LAB_0011ec13;
                }
LAB_0011ea31:
                if (*(char *)(lVar13 + -2 + uVar19) != '\0') {
                  if (*(char *)(lVar5 + uVar19) != '\0') goto LAB_0011ebd3;
                  goto LAB_0011ec13;
                }
              }
LAB_0011ecc0:
              uVar6 = *(uint *)(lVar12 + uVar19 * 4);
              uVar15 = *(uint *)(lVar18 + (uVar19 - 2) * 4);
              goto LAB_0011ecdf;
            }
LAB_0011e92e:
            if (((uVar17 != 0) && ((long)uVar8 < lVar20)) && (*(char *)(lVar13 + uVar8) != '\0'))
            goto LAB_0011eaeb;
            if ((uVar17 == 0) || (lVar20 <= (long)(uVar19 + 2))) {
              if (uVar17 == 0) goto LAB_0011eb81;
            }
            else if (*(char *)(lVar13 + uVar19 + 2) != '\0') {
              if (*(char *)(lVar13 + uVar19) == '\0') goto LAB_0011ec7c;
              goto LAB_0011eabd;
            }
            if (*(char *)(lVar13 + uVar19) != '\0') goto LAB_0011eaeb;
LAB_0011eb81:
            uVar6 = TTA::NewLabel();
            goto LAB_0011eda7;
          }
          if ((uVar19 == 0) ||
             ((*(char *)((uVar19 - 1) + lVar11) == '\0' && (*(char *)(lVar14 + -1 + uVar19) == '\0')
              ))) {
            uVar6 = TTA::NewLabel();
          }
          else {
            uVar6 = *(uint *)(lVar18 + -8 + uVar19 * 4);
          }
          *(uint *)(lVar18 + uVar19 * 4) = uVar6;
        }
        else {
          uVar8 = uVar19 | 1;
          if ((long)uVar8 < lVar20) {
            if (*(char *)(lVar14 + uVar8) != '\0') goto LAB_0011e92e;
            if ((lVar9 <= (long)uVar7) || (*(char *)(lVar11 + uVar8) == '\0')) goto LAB_0011eb52;
            goto LAB_0011eb81;
          }
LAB_0011eb52:
          *(undefined4 *)(lVar18 + uVar19 * 4) = 0;
        }
      }
      else {
        if (uVar19 == 0) {
LAB_0011ea52:
          uVar8 = uVar19 | 1;
          if ((uVar17 == 0) || ((lVar20 <= (long)uVar8 || (*(char *)(lVar13 + uVar8) == '\0')))) {
            if (((long)uVar8 < lVar20) &&
               (((*(char *)(lVar14 + uVar8) != '\0' && (uVar17 != 0)) &&
                ((long)(uVar19 + 2) < lVar20)))) {
              if (*(char *)(lVar13 + uVar19 + 2) != '\0') {
                if (*(char *)(lVar13 + uVar19) == '\0') {
                  if ((uVar19 == 0) || (*(char *)(lVar13 + -1 + uVar19) == '\0')) {
LAB_0011ec7c:
                    uVar6 = *(uint *)(lVar12 + 8 + uVar19 * 4);
                    goto LAB_0011eda7;
                  }
                  if (*(char *)(lVar16 + uVar8) == '\0') goto LAB_0011ec72;
                  goto LAB_0011ea7d;
                }
LAB_0011eabd:
                if ((lVar20 <= (long)uVar8) || (*(char *)(lVar16 + uVar8) == '\0')) {
                  uVar6 = *(uint *)(lVar12 + uVar19 * 4);
                  goto LAB_0011ead1;
                }
                goto LAB_0011eaeb;
              }
            }
            else if (uVar17 == 0) goto LAB_0011eb81;
            if (*(char *)(lVar13 + uVar19) != '\0') goto LAB_0011eaeb;
            if ((uVar17 == 0 || uVar19 == 0) || (*(char *)(lVar13 + -1 + uVar19) == '\0'))
            goto LAB_0011eb81;
          }
          else {
            if (((*(char *)(lVar13 + uVar19) != '\0') || (uVar19 == 0)) ||
               (*(char *)(lVar13 + -1 + uVar19) == '\0')) {
LAB_0011eaeb:
              uVar6 = *(uint *)(lVar12 + uVar19 * 4);
              goto LAB_0011eda7;
            }
LAB_0011ea7d:
            if (*(char *)(lVar16 + uVar19) == '\0') {
LAB_0011ec13:
              uVar6 = *(uint *)(lVar12 + -8 + uVar19 * 4);
              goto LAB_0011ec18;
            }
          }
LAB_0011eb2d:
          uVar6 = *(uint *)(lVar12 + -8 + uVar19 * 4);
        }
        else {
          if (*(char *)(lVar14 + -1 + uVar19) == '\0') {
            if ((lVar9 <= (long)uVar7) || (*(char *)(lVar11 + -1 + uVar19) == '\0'))
            goto LAB_0011ea52;
            uVar8 = uVar19 | 1;
            if (((uVar17 == 0) || (lVar20 <= (long)uVar8)) || (*(char *)(lVar13 + uVar8) == '\0')) {
              if (((lVar20 <= (long)uVar8) || (*(char *)(lVar14 + uVar8) == '\0')) ||
                 ((uVar17 == 0 ||
                  ((lVar20 <= (long)(uVar19 + 2) || (*(char *)(lVar13 + uVar19 + 2) == '\0')))))) {
                if (uVar17 == 0) goto LAB_0011eda2;
                if (*(char *)(lVar13 + -1 + uVar19) == '\0') {
                  if (*(char *)(lVar13 + uVar19) == '\0') goto LAB_0011eda2;
                  if (*(char *)((uVar19 - 2) + lVar14) == '\0') goto LAB_0011ecd6;
                  goto LAB_0011ec99;
                }
                uVar6 = *(uint *)(lVar12 + -8 + uVar19 * 4);
                if (*(char *)(lVar14 + -2 + uVar19) == '\0') goto LAB_0011ecda;
LAB_0011ecb6:
                *(uint *)(lVar18 + uVar19 * 4) = uVar6;
                goto LAB_0011edac;
              }
              if (*(char *)(lVar14 + -2 + uVar19) == '\0') {
                if (*(char *)(lVar13 + uVar19) == '\0') {
                  if (*(char *)(lVar13 + -1 + uVar19) != '\0') {
                    if (*(char *)(lVar16 + uVar8) != '\0') goto LAB_0011ecfe;
                    uVar6 = *(uint *)(lVar12 + -8 + uVar19 * 4);
                    goto LAB_0011ee3b;
                  }
LAB_0011e9b7:
                  uVar6 = *(uint *)(lVar12 + 8 + uVar19 * 4);
                }
                else {
                  uVar6 = *(uint *)(lVar12 + uVar19 * 4);
                  if (*(char *)(lVar16 + uVar8) == '\0') {
LAB_0011ee3b:
                    uVar15 = *(uint *)(lVar12 + 8 + uVar19 * 4);
                    goto LAB_0011ee40;
                  }
                }
                goto LAB_0011ecda;
              }
              if (*(char *)(lVar13 + -1 + uVar19) == '\0') {
                if (*(char *)(lVar16 + uVar8) != '\0') goto LAB_0011ea31;
                if (*(char *)(lVar13 + uVar19) == '\0') goto LAB_0011e9b7;
LAB_0011edc8:
                lVar1 = uVar19 - 2;
                if (((uVar19 == 0 || uVar17 == 0) || (*(char *)(lVar13 + lVar1) == '\0')) ||
                   (*(char *)(lVar5 + uVar19) == '\0')) {
                  uVar6 = TTA::Merge(*(uint *)(lVar12 + uVar19 * 4),
                                     *(uint *)(lVar12 + 8 + uVar19 * 4));
                  uVar15 = *(uint *)(lVar18 + lVar1 * 4);
                  goto LAB_0011ecdf;
                }
                uVar6 = *(uint *)(lVar12 + lVar1 * 4);
              }
              else {
                if (*(char *)(lVar16 + uVar8) != '\0') goto LAB_0011ebd3;
LAB_0011ec72:
                uVar6 = *(uint *)(lVar12 + -8 + uVar19 * 4);
              }
LAB_0011ead1:
              uVar15 = *(uint *)(lVar12 + 8 + uVar19 * 4);
            }
            else {
              if (*(char *)((uVar19 - 2) + lVar14) != '\0') goto LAB_0011ea0d;
              if ((*(char *)(lVar13 + uVar19) != '\0') || (*(char *)(lVar13 + -1 + uVar19) == '\0'))
              goto LAB_0011ecd6;
LAB_0011ecfe:
              if ((uVar17 != 0) && (*(char *)(lVar16 + uVar19) != '\0')) {
                uVar6 = *(uint *)(lVar12 + -8 + uVar19 * 4);
                goto LAB_0011ecda;
              }
              uVar6 = *(uint *)(lVar12 + -8 + uVar19 * 4);
              uVar15 = *(uint *)(lVar12 + uVar19 * 4);
LAB_0011ee40:
              uVar6 = TTA::Merge(uVar6,uVar15);
              uVar15 = *(uint *)(lVar18 + -8 + uVar19 * 4);
            }
          }
          else {
            uVar8 = uVar19 | 1;
            if (((uVar17 == 0) || (lVar20 <= (long)uVar8)) || (*(char *)(lVar13 + uVar8) == '\0')) {
              if (((long)uVar8 < lVar20) && (*(char *)(lVar14 + uVar8) != '\0')) {
LAB_0011e986:
                if ((uVar17 != 0) &&
                   (((long)(uVar19 + 2) < lVar20 && (*(char *)(lVar13 + uVar19 + 2) != '\0')))) {
                  if (*(char *)(lVar16 + 1 + uVar19) == '\0') goto LAB_0011e9b7;
                  goto LAB_0011e873;
                }
              }
LAB_0011eda2:
              uVar6 = *(uint *)(lVar18 + -8 + uVar19 * 4);
              goto LAB_0011eda7;
            }
LAB_0011e873:
            if (*(char *)(lVar13 + uVar19) != '\0') goto LAB_0011eaeb;
            cVar2 = *(char *)(lVar16 + uVar19);
joined_r0x0011ed97:
            if (cVar2 == '\0') {
LAB_0011ecd6:
              uVar6 = *(uint *)(lVar12 + uVar19 * 4);
LAB_0011ecda:
              uVar15 = *(uint *)(lVar18 + -8 + uVar19 * 4);
              goto LAB_0011ecdf;
            }
            if (uVar19 == 0 || uVar17 == 0) goto LAB_0011ecc0;
            if (*(char *)(lVar13 + -1 + uVar19) != '\0') goto LAB_0011eb2d;
LAB_0011ec99:
            if (*(char *)(lVar13 + -2 + uVar19) == '\0') goto LAB_0011ecc0;
            uVar6 = *(uint *)(lVar12 + -8 + uVar19 * 4);
            if (*(char *)(lVar5 + uVar19) != '\0') goto LAB_0011ecb6;
LAB_0011ec18:
            uVar15 = *(uint *)(lVar12 + uVar19 * 4);
          }
LAB_0011ecdf:
          uVar6 = TTA::Merge(uVar6,uVar15);
        }
LAB_0011eda7:
        *(uint *)(lVar18 + uVar19 * 4) = uVar6;
      }
LAB_0011edac:
    }
    uVar17 = uVar17 + 2;
  } while( true );
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }